

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

mempool * memory_allocate_mempool(uint32_t num_entries,uint32_t entry_size)

{
  mempool *pmVar1;
  uintptr_t *puVar2;
  uintptr_t uVar3;
  uint in_ESI;
  uint in_EDI;
  dma_memory dVar4;
  pkt_buf *buf;
  uint32_t i;
  dma_memory mem;
  mempool *mempool;
  void *in_stack_00000640;
  undefined1 in_stack_00001a9f;
  size_t in_stack_00001aa0;
  uint local_34;
  uint local_24;
  void *local_20;
  
  local_34 = in_ESI;
  if (in_ESI == 0) {
    local_34 = 0x800;
  }
  if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && ((int)(0x200000 % (ulong)local_34) != 0)) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): entry size must be a divisor of the huge page size (%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x61,
            "memory_allocate_mempool",0x200000);
    abort();
  }
  pmVar1 = (mempool *)malloc((ulong)in_EDI * 4 + 0x18);
  dVar4 = memory_allocate_dma(in_stack_00001aa0,(_Bool)in_stack_00001a9f);
  pmVar1->num_entries = in_EDI;
  pmVar1->buf_size = local_34;
  local_20 = dVar4.virt;
  pmVar1->base_addr = local_20;
  pmVar1->free_stack_top = in_EDI;
  for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
    *(uint *)(&pmVar1->field_0x14 + (ulong)local_24 * 4) = local_24;
    puVar2 = (uintptr_t *)((long)pmVar1->base_addr + (ulong)(local_24 * local_34));
    if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
      uVar3 = virt_to_phys(in_stack_00000640);
      *puVar2 = uVar3;
    }
    else {
      *puVar2 = (uintptr_t)puVar2;
    }
    *(uint *)(puVar2 + 2) = local_24;
    puVar2[1] = (uintptr_t)pmVar1;
    *(undefined4 *)((long)puVar2 + 0x14) = 0;
  }
  return pmVar1;
}

Assistant:

struct mempool* memory_allocate_mempool(uint32_t num_entries, uint32_t entry_size) {
	entry_size = entry_size ? entry_size : 2048;
	// require entries that neatly fit into the page size, this makes the memory pool much easier
	// otherwise our base_addr + index * size formula would be wrong because we can't cross a page-boundary
	if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && HUGE_PAGE_SIZE % entry_size) {
		error("entry size must be a divisor of the huge page size (%d)", HUGE_PAGE_SIZE);
	}
	struct mempool* mempool = (struct mempool*) malloc(sizeof(struct mempool) + num_entries * sizeof(uint32_t));
	struct dma_memory mem = memory_allocate_dma(num_entries * entry_size, false);
	mempool->num_entries = num_entries;
	mempool->buf_size = entry_size;
	mempool->base_addr = mem.virt;
	mempool->free_stack_top = num_entries;
	for (uint32_t i = 0; i < num_entries; i++) {
		mempool->free_stack[i] = i;
		struct pkt_buf* buf = (struct pkt_buf*) (((uint8_t*) mempool->base_addr) + i * entry_size);
		if (VFIO_CONTAINER_FILE_DESCRIPTOR != -1) {
			// "physical" memory is iova address which is identity mapped to vaddr
			buf->buf_addr_phy = (uintptr_t) buf;
		} else {
			// physical addresses are not contiguous within a pool, we need to get the mapping
			// minor optimization opportunity: this only needs to be done once per page
			buf->buf_addr_phy = virt_to_phys(buf);
		}
		buf->mempool_idx = i;
		buf->mempool = mempool;
		buf->size = 0;
	}
	return mempool;
}